

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddWindowToDrawData(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  ImGuiWindow *window_00;
  int iVar1;
  long lVar2;
  
  AddDrawListToDrawData(out_render_list,window->DrawList);
  iVar1 = (window->DC).ChildWindows.Size;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      window_00 = (window->DC).ChildWindows.Data[lVar2];
      if ((window_00->Active == true) && (window_00->HiddenFrames == 0)) {
        AddWindowToDrawData(out_render_list,window_00);
        iVar1 = (window->DC).ChildWindows.Size;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImVector<ImDrawList*>* out_render_list, ImGuiWindow* window)
{
    AddDrawListToDrawData(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (child->Active && child->HiddenFrames == 0) // clipped children may have been marked not active
            AddWindowToDrawData(out_render_list, child);
    }
}